

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int remap(KEYMAP *curmap,int c,PF funct,KEYMAP *pref_map)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  PF *pp_Var5;
  keymap_s *pkVar6;
  long lVar7;
  map_element *local_60;
  map_element *mep;
  PF *pfp;
  KEYMAP *newmap;
  KEYMAP *mp;
  int nold;
  int n2;
  int n1;
  int i;
  KEYMAP *pref_map_local;
  PF funct_local;
  KEYMAP *pKStack_18;
  int c_local;
  KEYMAP *curmap_local;
  
  sVar3 = (short)c;
  pKStack_18 = curmap;
  if ((ele < curmap->map_element + curmap->map_num) && (ele->k_base <= c)) {
    iVar4 = c - ele->k_base;
    if ((ele->k_funcp[iVar4] == funct) &&
       (((funct != (PF)0x0 || (pref_map == (KEYMAP *)0x0)) || (pref_map == ele->k_prefmap)))) {
      return 1;
    }
    if ((funct == (PF)0x0) && (ele->k_prefmap != (keymap_s *)0x0)) {
      n2 = 0;
      for (mp._4_4_ = 1; mp._4_4_ != 0 && n2 < iVar4;
          mp._4_4_ = ele->k_funcp[lVar7] != (PF)0x0 & mp._4_4_) {
        lVar7 = (long)n2;
        n2 = n2 + 1;
      }
      if ((curmap->map_max <= curmap->map_num) &&
         (pKStack_18 = reallocmap(curmap), pKStack_18 == (KEYMAP *)0x0)) {
        return 0;
      }
      pp_Var5 = (PF *)calloc((long)(int)((ele->k_num - c) + (uint)((mp._4_4_ != 0 ^ 0xffU) & 1)),8);
      if (pp_Var5 == (PF *)0x0) {
        iVar4 = dobeep_msg("Out of memory");
        return iVar4;
      }
      ele->k_funcp[iVar4] = (PF)0x0;
      for (n2 = iVar4 + mp._4_4_; n2 <= (int)ele->k_num - (int)ele->k_base; n2 = n2 + 1) {
        pp_Var5[(int)((n2 - iVar4) - mp._4_4_)] = ele->k_funcp[n2];
      }
      for (local_60 = pKStack_18->map_element + pKStack_18->map_num; ele < local_60;
          local_60 = local_60 + -1) {
        local_60->k_base = local_60[-1].k_base;
        local_60->k_num = local_60[-1].k_num;
        local_60->k_funcp = local_60[-1].k_funcp;
        local_60->k_prefmap = local_60[-1].k_prefmap;
      }
      ele->k_num = sVar3 - (ushort)((mp._4_4_ != 0 ^ 0xffU) & 1);
      ele[1].k_base = sVar3 + (short)mp._4_4_;
      ele[1].k_funcp = pp_Var5;
      ele = ele + (int)(uint)((mp._4_4_ != 0 ^ 0xffU) & 1);
      ele->k_prefmap = (keymap_s *)0x0;
      pKStack_18->map_num = pKStack_18->map_num + 1;
      if (pref_map == (KEYMAP *)0x0) {
        pkVar6 = (keymap_s *)malloc(0x70);
        if (pkVar6 == (keymap_s *)0x0) {
          dobeep_msg("Out of memory");
          ele->k_funcp[c - ele->k_base] = pKStack_18->map_default;
          return 0;
        }
        pkVar6->map_num = 0;
        pkVar6->map_max = 4;
        pkVar6->map_default = rescan;
        ele->k_prefmap = pkVar6;
      }
      else {
        ele->k_prefmap = pref_map;
      }
    }
    else {
      if (ele->k_funcp[iVar4] == (PF)0x0) {
        ele->k_prefmap = (keymap_s *)0x0;
      }
      ele->k_funcp[iVar4] = funct;
      if (funct == (PF)0x0) {
        if (pref_map == (KEYMAP *)0x0) {
          pkVar6 = (keymap_s *)malloc(0x70);
          if (pkVar6 == (keymap_s *)0x0) {
            dobeep_msg("Out of memory");
            ele->k_funcp[c - ele->k_base] = curmap->map_default;
            return 0;
          }
          pkVar6->map_num = 0;
          pkVar6->map_max = 4;
          pkVar6->map_default = rescan;
          ele->k_prefmap = pkVar6;
        }
        else {
          ele->k_prefmap = pref_map;
        }
      }
    }
  }
  else {
    if ((curmap->map_element < ele) &&
       ((funct != (PF)0x0 || (ele[-1].k_prefmap == (keymap_s *)0x0)))) {
      nold = c - ele[-1].k_num;
    }
    else {
      nold = 1000;
    }
    if ((ele < curmap->map_element + curmap->map_num) &&
       ((funct != (PF)0x0 || (ele->k_prefmap == (keymap_s *)0x0)))) {
      mp._4_4_ = ele->k_base - c;
    }
    else {
      mp._4_4_ = 1000;
    }
    if ((nold < 5) && (nold <= (int)mp._4_4_)) {
      ele = ele + -1;
      pp_Var5 = (PF *)calloc((long)((c - ele->k_base) + 1),8);
      if (pp_Var5 == (PF *)0x0) {
        iVar4 = dobeep_msg("Out of memory");
        return iVar4;
      }
      sVar1 = ele->k_num;
      sVar2 = ele->k_base;
      for (n2 = 0; n2 < ((int)sVar1 - (int)sVar2) + 1; n2 = n2 + 1) {
        pp_Var5[n2] = ele->k_funcp[n2];
      }
      while (nold = nold + -1, nold != 0) {
        pp_Var5[n2] = curmap->map_default;
        n2 = n2 + 1;
      }
      pp_Var5[n2] = funct;
      ele->k_num = sVar3;
      ele->k_funcp = pp_Var5;
    }
    else if ((int)mp._4_4_ < 5) {
      pp_Var5 = (PF *)calloc((long)((ele->k_num - c) + 1),8);
      if (pp_Var5 == (PF *)0x0) {
        iVar4 = dobeep_msg("Out of memory");
        return iVar4;
      }
      sVar1 = ele->k_num;
      sVar2 = ele->k_base;
      for (n2 = 0; n2 < ((int)sVar1 - (int)sVar2) + 1; n2 = n2 + 1) {
        pp_Var5[(int)(n2 + mp._4_4_)] = ele->k_funcp[n2];
      }
      while (mp._4_4_ = mp._4_4_ + -1, mp._4_4_ != 0) {
        pp_Var5[(int)mp._4_4_] = curmap->map_default;
      }
      *pp_Var5 = funct;
      ele->k_base = sVar3;
      ele->k_funcp = pp_Var5;
    }
    else {
      if ((curmap->map_max <= curmap->map_num) &&
         (pKStack_18 = reallocmap(curmap), pKStack_18 == (KEYMAP *)0x0)) {
        return 0;
      }
      pp_Var5 = (PF *)malloc(8);
      if (pp_Var5 == (PF *)0x0) {
        iVar4 = dobeep_msg("Out of memory");
        return iVar4;
      }
      *pp_Var5 = funct;
      for (local_60 = pKStack_18->map_element + pKStack_18->map_num; ele < local_60;
          local_60 = local_60 + -1) {
        local_60->k_base = local_60[-1].k_base;
        local_60->k_num = local_60[-1].k_num;
        local_60->k_funcp = local_60[-1].k_funcp;
        local_60->k_prefmap = local_60[-1].k_prefmap;
      }
      ele->k_base = sVar3;
      ele->k_num = sVar3;
      ele->k_funcp = pp_Var5;
      ele->k_prefmap = (keymap_s *)0x0;
      pKStack_18->map_num = pKStack_18->map_num + 1;
    }
    if (funct == (PF)0x0) {
      if (pref_map == (KEYMAP *)0x0) {
        pkVar6 = (keymap_s *)malloc(0x70);
        if (pkVar6 == (keymap_s *)0x0) {
          dobeep_msg("Out of memory");
          ele->k_funcp[c - ele->k_base] = pKStack_18->map_default;
          return 0;
        }
        pkVar6->map_num = 0;
        pkVar6->map_max = 4;
        pkVar6->map_default = rescan;
        ele->k_prefmap = pkVar6;
      }
      else {
        ele->k_prefmap = pref_map;
      }
    }
  }
  return 1;
}

Assistant:

static int
remap(KEYMAP *curmap, int c, PF funct, KEYMAP *pref_map)
{
	int		 i, n1, n2, nold;
	KEYMAP		*mp, *newmap;
	PF		*pfp;
	struct map_element	*mep;

	if (ele >= &curmap->map_element[curmap->map_num] || c < ele->k_base) {
		if (ele > &curmap->map_element[0] && (funct != NULL ||
		    (ele - 1)->k_prefmap == NULL))
			n1 = c - (ele - 1)->k_num;
		else
			n1 = HUGE;
		if (ele < &curmap->map_element[curmap->map_num] &&
		    (funct != NULL || ele->k_prefmap == NULL))
			n2 = ele->k_base - c;
		else
			n2 = HUGE;
		if (n1 <= MAPELEDEF && n1 <= n2) {
			ele--;
			if ((pfp = calloc(c - ele->k_base + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i] = ele->k_funcp[i];
			while (--n1)
				pfp[i++] = curmap->map_default;
			pfp[i] = funct;
			ele->k_num = c;
			ele->k_funcp = pfp;
		} else if (n2 <= MAPELEDEF) {
			if ((pfp = calloc(ele->k_num - c + 1,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			nold = ele->k_num - ele->k_base + 1;
			for (i = 0; i < nold; i++)
				pfp[i + n2] = ele->k_funcp[i];
			while (--n2)
				pfp[n2] = curmap->map_default;
			pfp[0] = funct;
			ele->k_base = c;
			ele->k_funcp = pfp;
		} else {
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = malloc(sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			pfp[0] = funct;
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_base = c;
			ele->k_num = c;
			ele->k_funcp = pfp;
			ele->k_prefmap = NULL;
			curmap->map_num++;
		}
		if (funct == NULL) {
			if (pref_map != NULL)
				ele->k_prefmap = pref_map;
			else {
				if ((mp = malloc(sizeof(KEYMAP) +
				    (MAPINIT - 1) * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			}
		}
	} else {
		n1 = c - ele->k_base;
		if (ele->k_funcp[n1] == funct && (funct != NULL ||
		    pref_map == NULL || pref_map == ele->k_prefmap))
			/* no change */
			return (TRUE);
		if (funct != NULL || ele->k_prefmap == NULL) {
			if (ele->k_funcp[n1] == NULL)
				ele->k_prefmap = NULL;
			/* easy case */
			ele->k_funcp[n1] = funct;
			if (funct == NULL) {
				if (pref_map != NULL)
					ele->k_prefmap = pref_map;
				else {
					if ((mp = malloc(sizeof(KEYMAP) +
					    (MAPINIT - 1) *
					    sizeof(struct map_element))) == NULL) {
						(void)dobeep_msg("Out of memory");
						ele->k_funcp[c - ele->k_base] =
						    curmap->map_default;
						return (FALSE);
					}
					mp->map_num = 0;
					mp->map_max = MAPINIT;
					mp->map_default = rescan;
					ele->k_prefmap = mp;
				}
			}
		} else {
			/*
			 * This case is the splits.
			 * Determine which side of the break c goes on
			 * 0 = after break; 1 = before break
			 */
			n2 = 1;
			for (i = 0; n2 && i < n1; i++)
				n2 &= ele->k_funcp[i] != NULL;
			if (curmap->map_num >= curmap->map_max) {
				if ((newmap = reallocmap(curmap)) == NULL)
					return (FALSE);
				curmap = newmap;
			}
			if ((pfp = calloc(ele->k_num - c + !n2,
			    sizeof(PF))) == NULL)
				return (dobeep_msg("Out of memory"));

			ele->k_funcp[n1] = NULL;
			for (i = n1 + n2; i <= ele->k_num - ele->k_base; i++)
				pfp[i - n1 - n2] = ele->k_funcp[i];
			for (mep = &curmap->map_element[curmap->map_num];
			    mep > ele; mep--) {
				mep->k_base = (mep - 1)->k_base;
				mep->k_num = (mep - 1)->k_num;
				mep->k_funcp = (mep - 1)->k_funcp;
				mep->k_prefmap = (mep - 1)->k_prefmap;
			}
			ele->k_num = c - !n2;
			(ele + 1)->k_base = c + n2;
			(ele + 1)->k_funcp = pfp;
			ele += !n2;
			ele->k_prefmap = NULL;
			curmap->map_num++;
			if (pref_map == NULL) {
				if ((mp = malloc(sizeof(KEYMAP) + (MAPINIT - 1)
				    * sizeof(struct map_element))) == NULL) {
					(void)dobeep_msg("Out of memory");
					ele->k_funcp[c - ele->k_base] =
					    curmap->map_default;
					return (FALSE);
				}
				mp->map_num = 0;
				mp->map_max = MAPINIT;
				mp->map_default = rescan;
				ele->k_prefmap = mp;
			} else
				ele->k_prefmap = pref_map;
		}
	}
	return (TRUE);
}